

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execMove6<(moira::Instr)71,(moira::Mode)11,(moira::Size)4>(Moira *this,u16 opcode)

{
  u16 uVar1;
  undefined1 uVar2;
  byte bVar3;
  u32 uVar4;
  u32 val;
  bool error;
  bool local_29;
  
  uVar1 = (this->queue).irc;
  readExt(this);
  val = CONCAT22(uVar1,(this->queue).irc);
  readExt(this);
  bVar3 = (byte)(uVar1 >> 8);
  (this->reg).sr.n = (bool)(bVar3 >> 7);
  uVar2 = false;
  if (uVar1 == 0) {
    uVar2 = (this->reg).sr.z;
  }
  (this->reg).sr.z = (bool)uVar2;
  uVar4 = computeEA<(moira::Mode)6,(moira::Size)4,0ul>(this,opcode >> 9 & 7);
  writeM<(moira::MemSpace)1,(moira::Size)4,0ul>(this,uVar4,val,&local_29);
  if (local_29 == false) {
    uVar4 = (this->reg).pc;
    (this->reg).pc0 = uVar4;
    (this->queue).ird = (this->queue).irc;
    uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar4 + 2);
    (this->queue).irc = (u16)uVar4;
    (this->reg).sr.n = (bool)(bVar3 >> 7);
    (this->reg).sr.z = val == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
  }
  return;
}

Assistant:

void
Moira::execMove6(u16 opcode)
{
    u32 ea, data;
    
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);
    
    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;
    
    if (S == Long && (M == MODE_DN || M == MODE_AN || M == MODE_IM)) {
        reg.sr.n = NBIT<Word>(data >> 16);
        reg.sr.z = ZERO<Word>(data >> 16) && reg.sr.z;
    } else {
        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }
    
    if (!writeOp <MODE_IX,S> (dst, data)) return;
    prefetch<POLLIPL>();

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
}